

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O1

int __thiscall ncnn::Deconvolution_x86_fma::create_pipeline(Deconvolution_x86_fma *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  int *piVar4;
  Layer *pLVar5;
  _func_int ***ppp_Var6;
  int k;
  ulong uVar7;
  ulong uVar8;
  undefined4 *puVar9;
  Option *pOVar10;
  int _w;
  ulong uVar11;
  undefined4 *puVar12;
  _func_int ***ppp_Var13;
  int _elempack;
  long lVar14;
  ulong uVar15;
  _func_int ***ppp_Var16;
  int iVar17;
  _func_int ***ppp_Var18;
  int _h;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ParamDict pd;
  ParamDict pd_5;
  Mat local_138;
  ParamDict local_f0;
  ulong local_e0;
  Mat local_d8;
  ulong local_90;
  ulong local_88;
  Allocator *local_80;
  ulong local_78;
  int local_6c;
  Option *local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  _func_int **local_48;
  ModelBinFromMatArray local_40;
  
  p_Var2 = this->_vptr_Deconvolution_x86_fma[-3];
  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var2)) {
  case 1:
    pLVar5 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_138);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 2:
    pLVar5 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_138);
    ParamDict::set((ParamDict *)&local_138,0,**(float **)(&this->field_0x118 + (long)p_Var2));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 3:
    pLVar5 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_138);
    ParamDict::set((ParamDict *)&local_138,0,**(float **)(&this->field_0x118 + (long)p_Var2));
    ParamDict::set((ParamDict *)&local_138,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var2) + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 4:
    pLVar5 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_138);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 5:
    pLVar5 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_138);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 6:
    pLVar5 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_138);
    ParamDict::set((ParamDict *)&local_138,0,**(float **)(&this->field_0x118 + (long)p_Var2));
    ParamDict::set((ParamDict *)&local_138,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var2) + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  default:
    pLVar5 = (Layer *)0x0;
    goto LAB_00292eb1;
  }
  ParamDict::~ParamDict((ParamDict *)&local_138);
LAB_00292eb1:
  if (pLVar5 != (Layer *)0x0) {
    (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
  }
  this->activation = pLVar5;
  p_Var2 = this->_vptr_Deconvolution_x86_fma[-3];
  uVar11 = (long)*(int *)(&this->field_0xd8 + (long)p_Var2) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var2);
  uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var2);
  _w = (int)uVar11;
  uVar20 = (long)*(int *)(&this->field_0x110 + (long)p_Var2) / (long)_w;
  uVar22 = (long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff) /
           (long)(int)uVar1;
  uVar20 = 1;
  local_90 = 1;
  if (opt->use_packing_layout == true) {
    local_90 = (ulong)((uVar22 & 3) == 0) * 3 + 1;
    if ((uVar22 & 7) == 0) {
      local_90 = 8;
    }
    uVar20 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
    if ((uVar1 & 7) == 0) {
      uVar20 = 8;
    }
  }
  _h = (int)uVar22;
  local_88 = uVar20;
  local_78 = uVar11;
  local_68 = opt;
  if (opt->use_sgemm_convolution == true) {
    pLVar5 = create_layer(0x4a);
    this->gemm = pLVar5;
    ParamDict::ParamDict(&local_f0);
    ParamDict::set(&local_f0,2,1);
    ParamDict::set(&local_f0,3,0);
    ParamDict::set(&local_f0,4,1);
    ParamDict::set(&local_f0,5,0);
    ParamDict::set(&local_f0,6,1);
    ParamDict::set(&local_f0,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_fma[-3]) * _w);
    ParamDict::set(&local_f0,8,0);
    ParamDict::set(&local_f0,9,_h);
    ParamDict::set(&local_f0,10,-1);
    ParamDict::set(&local_f0,0xb,0);
    ParamDict::set(&local_f0,0xc,(int)uVar20);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_f0);
    local_138.cstep = 0;
    local_138.data = (Allocator *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elempack = 0;
    local_138._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    local_138.elemsize._4_4_ = (int)local_138.refcount;
    local_138.allocator = (Allocator *)local_138.data;
    local_138.dims = (int)local_138.refcount;
    local_138.w = local_138.refcount._4_4_;
    local_138.c = local_138.elempack;
    Mat::reshape(&local_d8,(Mat *)(&this->field_0x160 + (long)this->_vptr_Deconvolution_x86_fma[-3])
                 ,_w,_h,*(int *)&((Mat *)(&this->field_0x160 +
                                         (long)this->_vptr_Deconvolution_x86_fma[-3]))[-2].data,
                 (Allocator *)0x0);
    Mat::create(&local_138,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_fma[-3]) * _w,_h,4,
                (Allocator *)0x0);
    pOVar10 = local_68;
    if (0 < _h) {
      local_80 = (Allocator *)local_138.data;
      local_e0 = (long)local_138.w *
                 CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize);
      pp_Var3 = this->_vptr_Deconvolution_x86_fma;
      uVar15 = 0;
      uVar11 = uVar20;
      do {
        if ((int)uVar11 <= *(int *)(&this->field_0xd0 + (long)pp_Var3[-3])) {
          ppp_Var6 = (_func_int ***)
                     ((long)(_func_int ***)local_d8.data +
                     CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * uVar15 *
                     (long)local_d8.w);
          lVar21 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * local_d8.cstep;
          ppp_Var16 = (_func_int ***)((long)(_func_int ***)local_138.data + local_e0 * uVar15);
          lVar19 = 0;
          do {
            if (0 < (int)local_78) {
              uVar7 = 0;
              uVar11 = uVar20;
              ppp_Var18 = ppp_Var6;
              ppp_Var13 = ppp_Var6;
              do {
                do {
                  *(undefined4 *)ppp_Var16 = *(undefined4 *)ppp_Var18;
                  ppp_Var16 = (_func_int ***)((long)ppp_Var16 + 4);
                  uVar11 = uVar11 - 1;
                  ppp_Var18 = (_func_int ***)((long)ppp_Var18 + lVar21);
                } while (uVar11 != 0);
                uVar7 = uVar7 + 1;
                ppp_Var18 = (_func_int ***)((long)ppp_Var13 + 4);
                uVar11 = uVar20;
                ppp_Var13 = ppp_Var18;
              } while (uVar7 != (local_78 & 0xffffffff));
            }
            lVar19 = lVar19 + uVar20;
            ppp_Var6 = (_func_int ***)((long)ppp_Var6 + lVar21 * uVar20);
          } while ((long)((ulong)((int)uVar20 - 1) + lVar19) <
                   (long)*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]));
        }
        uVar15 = uVar15 + 1;
        uVar11 = local_88;
      } while (uVar15 != (uVar22 & 0xffffffff));
    }
    piVar4 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_d8.data != (Allocator *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_138.refcount._4_4_,(int)local_138.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    local_d8.data = local_138.data;
    local_d8.refcount._0_4_ = (int)local_138.refcount;
    local_d8.refcount._4_4_ = local_138.refcount._4_4_;
    local_d8.elemsize._0_4_ = (undefined4)local_138.elemsize;
    local_d8.elemsize._4_4_ = local_138.elemsize._4_4_;
    local_d8.elempack = local_138.elempack;
    local_d8.allocator = local_138.allocator;
    local_d8.dims = local_138.dims;
    local_d8.w = local_138.w;
    local_d8.h = local_138.h;
    local_d8.d = local_138.d;
    local_d8.c = local_138.c;
    local_d8.cstep = local_138.cstep;
    pLVar5 = this->gemm;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_d8);
    (*pLVar5->_vptr_Layer[3])(pLVar5,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*this->gemm->_vptr_Layer[4])(this->gemm,pOVar10);
    piVar4 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_d8.data != (Allocator *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_138.refcount._4_4_,(int)local_138.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_138.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_138.data != (Allocator *)0x0) {
            free(local_138.data);
          }
        }
        else {
          (*(local_138.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elemsize._4_4_ = 0;
    local_138.elempack = 0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
    ParamDict::~ParamDict(&local_f0);
  }
  else {
    local_138.cstep = 0;
    local_138.data = (Allocator *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elempack = 0;
    local_138._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    iVar17 = 0;
    local_138.elemsize._4_4_ = (int)local_138.refcount;
    local_138.allocator = (Allocator *)local_138.data;
    local_138.dims = (int)local_138.refcount;
    local_138.w = local_138.refcount._4_4_;
    local_138.c = local_138.elempack;
    Mat::create(&local_138,
                *(int *)(&this->field_0x18c + (long)this->_vptr_Deconvolution_x86_fma[-3]),4,
                (Allocator *)0x0);
    pp_Var3 = this->_vptr_Deconvolution_x86_fma;
    if (0 < *(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) * _h) {
      lVar19 = *(long *)(&this->field_0x160 + (long)pp_Var3[-3]);
      puVar9 = (undefined4 *)((long)local_138.data + uVar11 * 4 + -4);
      do {
        if (0 < _w) {
          uVar20 = 0;
          puVar12 = puVar9;
          do {
            *puVar12 = *(undefined4 *)(lVar19 + uVar20 * 4);
            uVar20 = uVar20 + 1;
            puVar12 = puVar12 + -1;
          } while ((uVar11 & 0xffffffff) != uVar20);
        }
        iVar17 = iVar17 + 1;
        lVar19 = lVar19 + uVar11 * 4;
        puVar9 = puVar9 + uVar11;
      } while (iVar17 < *(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) * _h);
    }
    Mat::reshape(&local_d8,&local_138,_w,_h,*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]),
                 (Allocator *)0x0);
    iVar17 = (int)local_88;
    _elempack = (int)local_90 * iVar17;
    Mat::create(&this->weight_data_tm,_w,
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar22 & 0xffffffff) /
                     (long)(int)local_90),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_fma[-3]) / iVar17,
                (ulong)(uint)(_elempack * 4),_elempack,(Allocator *)0x0);
    pOVar10 = local_68;
    local_48 = this->_vptr_Deconvolution_x86_fma;
    if (iVar17 <= *(int *)(&this->field_0xd0 + (long)local_48[-3])) {
      local_50 = (ulong)((int)local_88 - 1);
      local_58 = (this->weight_data_tm).data;
      local_60 = (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize;
      uVar20 = local_90 & 0xffffffff;
      local_80 = (Allocator *)((long)_h - (ulong)((int)local_90 - 1));
      uVar22 = local_88 & 0xffffffff;
      local_e0 = 0;
      do {
        if ((int)local_90 <= _h) {
          puVar9 = (undefined4 *)
                   ((int)((local_e0 & 0xffffffff) / (local_88 & 0xffffffff)) * local_60 +
                   (long)local_58);
          lVar14 = local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          ppp_Var16 = (_func_int ***)((long)(_func_int ***)local_d8.data + lVar14 * local_e0);
          lVar19 = (long)local_d8.w *
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          lVar21 = 0;
          do {
            if (0 < (int)local_78) {
              uVar15 = 0;
              ppp_Var6 = ppp_Var16;
              do {
                uVar8 = 0;
                uVar7 = uVar22;
                ppp_Var18 = ppp_Var6;
                ppp_Var13 = ppp_Var6;
                do {
                  do {
                    *puVar9 = *(undefined4 *)ppp_Var18;
                    puVar9 = puVar9 + 1;
                    uVar7 = uVar7 - 1;
                    ppp_Var18 = (_func_int ***)((long)ppp_Var18 + lVar14);
                  } while (uVar7 != 0);
                  uVar8 = uVar8 + 1;
                  ppp_Var18 = (_func_int ***)((long)ppp_Var13 + lVar19);
                  uVar7 = uVar22;
                  ppp_Var13 = ppp_Var18;
                } while (uVar8 != uVar20);
                uVar15 = uVar15 + 1;
                ppp_Var6 = (_func_int ***)((long)ppp_Var6 + 4);
              } while (uVar15 != (uVar11 & 0xffffffff));
            }
            lVar21 = lVar21 + uVar20;
            ppp_Var16 = (_func_int ***)((long)ppp_Var16 + lVar19 * uVar20);
          } while (lVar21 < (long)local_80);
        }
        local_e0 = local_e0 + uVar22;
        local_6c = _h;
      } while ((long)(local_50 + local_e0) < (long)*(int *)(&this->field_0xd0 + (long)local_48[-3]))
      ;
    }
    piVar4 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_d8.data != (Allocator *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_138.refcount._4_4_,(int)local_138.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_138.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_138.data != (Allocator *)0x0) {
            free(local_138.data);
          }
        }
        else {
          (*(local_138.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elemsize._4_4_ = 0;
    local_138.elempack = 0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
  }
  if (pOVar10->lightmode == true) {
    p_Var2 = this->_vptr_Deconvolution_x86_fma[-3];
    piVar4 = *(int **)(&this->field_0x168 + (long)p_Var2);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x160 + (long)p_Var2) != (void *)0x0) {
            free(*(void **)(&this->field_0x160 + (long)p_Var2));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86_fma::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}